

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_begin_string_byname(char *attr_name,char *val)

{
  size_t size;
  Variant local_88 [2];
  allocator<char> local_61;
  string local_60;
  Attribute local_40;
  Attribute attr;
  Caliper c;
  char *val_local;
  char *attr_name_local;
  
  cali::Caliper::Caliper((Caliper *)&attr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,attr_name,&local_61);
  local_40 = cali::Caliper::create_attribute
                       ((Caliper *)&attr,&local_60,CALI_TYPE_STRING,0,0,(Attribute *)0x0,
                        (Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  size = strlen(val);
  cali::Variant::Variant(local_88,CALI_TYPE_STRING,val,size);
  cali::Caliper::begin((Caliper *)&attr,&local_40,local_88);
  cali::Caliper::~Caliper((Caliper *)&attr);
  return;
}

Assistant:

void cali_begin_string_byname(const char* attr_name, const char* val)
{
    Caliper   c;
    Attribute attr = c.create_attribute(attr_name, CALI_TYPE_STRING, CALI_ATTR_DEFAULT);

    c.begin(attr, Variant(CALI_TYPE_STRING, val, strlen(val)));
}